

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
::Item(List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *this,int index,RecyclerWeakReference<Js::ScriptFunctionType> **item)

{
  RecyclerWeakReference<Js::ScriptFunctionType> *ptr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> **ppWVar4;
  RecyclerWeakReference<Js::ScriptFunctionType> **item_local;
  int index_local;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *this_local;
  
  if ((index < 0) ||
     ((this->
      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x167,"(index >= 0 && index < this->count)",
                       "index >= 0 && index < this->count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ptr = *item;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                        ).buffer);
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_>::operator=
            (*ppWVar4 + index,ptr);
  return;
}

Assistant:

void Item(int index, const T& item)
        {
            Assert(index >= 0 && index < this->count);
            this->buffer[index] = item;
        }